

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::PackageExportDeclarationSyntax::PackageExportDeclarationSyntax
          (PackageExportDeclarationSyntax *this,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,Token keyword,
          SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax> *items,Token semi)

{
  Token TVar1;
  bool bVar2;
  PackageImportItemSyntax *pPVar3;
  undefined8 uVar4;
  PackageImportItemSyntax *child;
  iterator __end2;
  iterator __begin2;
  SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax> *__range2;
  SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax> *items_local;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes_local;
  PackageExportDeclarationSyntax *this_local;
  Token keyword_local;
  
  TVar1 = semi;
  uVar4 = keyword._0_8_;
  MemberSyntax::MemberSyntax(&this->super_MemberSyntax,PackageExportDeclaration,attributes);
  (this->keyword).kind = (short)uVar4;
  (this->keyword).field_0x2 = (char)((ulong)uVar4 >> 0x10);
  (this->keyword).numFlags = (NumericTokenFlags)(char)((ulong)uVar4 >> 0x18);
  (this->keyword).rawLen = (int)((ulong)uVar4 >> 0x20);
  (this->keyword).info = keyword.info;
  SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax>::SeparatedSyntaxList
            (&this->items,items);
  (this->semi).kind = semi.kind;
  (this->semi).field_0x2 = semi._2_1_;
  (this->semi).numFlags = (NumericTokenFlags)semi.numFlags.raw;
  (this->semi).rawLen = semi.rawLen;
  semi.info = TVar1.info;
  (this->semi).info = semi.info;
  (this->items).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  join_0x00000010_0x00000000_ =
       SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax>::begin(&this->items);
  _child = SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax>::end(&this->items);
  while( true ) {
    bVar2 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax>::iterator_base<slang::syntax::PackageImportItemSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::PackageImportItemSyntax_*,_unsigned_long,_slang::syntax::PackageImportItemSyntax_**,_slang::syntax::PackageImportItemSyntax_*&>
            ::operator!=((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax>::iterator_base<slang::syntax::PackageImportItemSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::PackageImportItemSyntax_*,_unsigned_long,_slang::syntax::PackageImportItemSyntax_**,_slang::syntax::PackageImportItemSyntax_*&>
                          *)&__end2.index,
                         (iterator_base<slang::syntax::PackageImportItemSyntax_*> *)&child);
    if (!bVar2) break;
    pPVar3 = SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax>::
             iterator_base<slang::syntax::PackageImportItemSyntax_*>::operator*
                       ((iterator_base<slang::syntax::PackageImportItemSyntax_*> *)&__end2.index);
    (pPVar3->super_SyntaxNode).parent = (SyntaxNode *)this;
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax>::iterator_base<slang::syntax::PackageImportItemSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::PackageImportItemSyntax_*,_unsigned_long,_slang::syntax::PackageImportItemSyntax_**,_slang::syntax::PackageImportItemSyntax_*&>
    ::operator++((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax>::iterator_base<slang::syntax::PackageImportItemSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::PackageImportItemSyntax_*,_unsigned_long,_slang::syntax::PackageImportItemSyntax_**,_slang::syntax::PackageImportItemSyntax_*&>
                  *)&__end2.index);
  }
  return;
}

Assistant:

PackageExportDeclarationSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token keyword, const SeparatedSyntaxList<PackageImportItemSyntax>& items, Token semi) :
        MemberSyntax(SyntaxKind::PackageExportDeclaration, attributes), keyword(keyword), items(items), semi(semi) {
        this->items.parent = this;
        for (auto child : this->items)
            child->parent = this;
    }